

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cc
# Opt level: O0

Result __thiscall wabt::anon_unknown_7::Validator::BeginIfExpr(Validator *this,IfExpr *expr)

{
  Opcode local_24;
  IfExpr *local_20;
  IfExpr *expr_local;
  Validator *this_local;
  
  this->expr_loc_ = &(expr->super_ExprMixin<(wabt::ExprType)19>).super_Expr.loc;
  local_20 = expr;
  expr_local = (IfExpr *)this;
  Opcode::Opcode(&local_24,If);
  CheckBlockDeclaration
            (this,&(expr->super_ExprMixin<(wabt::ExprType)19>).super_Expr.loc,local_24,
             &(local_20->true_).decl);
  TypeChecker::OnIf(&this->typechecker_,&(local_20->true_).decl.sig.param_types,
                    &(local_20->true_).decl.sig.result_types);
  Result::Result((Result *)((long)&this_local + 4),Ok);
  return (Result)this_local._4_4_;
}

Assistant:

Result Validator::BeginIfExpr(IfExpr* expr) {
  expr_loc_ = &expr->loc;
  CheckBlockDeclaration(&expr->loc, Opcode::If, &expr->true_.decl);
  typechecker_.OnIf(expr->true_.decl.sig.param_types,
                    expr->true_.decl.sig.result_types);
  return Result::Ok;
}